

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O3

bool __thiscall kws::Generator::GenerateHTML(Generator *this,char *dir,bool showAllErrors)

{
  pointer pcVar1;
  iterator __position;
  size_type sVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  uint uVar5;
  Status SVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  pointer pEVar10;
  unsigned_long uVar11;
  ostream *poVar12;
  ulong uVar13;
  undefined7 in_register_00000011;
  unsigned_long *puVar14;
  char *pcVar15;
  char cVar16;
  pointer ppVar17;
  pointer pEVar18;
  pointer pPVar19;
  pointer *pplVar20;
  bool bVar21;
  CopyStatus CVar22;
  string filename2;
  string errorTag;
  string filename;
  string l;
  Directory directory;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  errorLines;
  string imagedir;
  ErrorVectorType errors;
  string imageProjectLogo;
  undefined1 auStack_368 [15];
  char local_359;
  pointer local_358;
  uint local_34c;
  string local_348;
  value_type local_328;
  string local_308;
  string local_2e8;
  undefined4 local_2c4;
  undefined8 local_2c0;
  char *local_2b8;
  Directory local_2b0;
  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
  local_2a8;
  Generator *local_288;
  char *local_280;
  long local_278;
  char local_270 [16];
  char *local_260;
  unsigned_long local_258;
  ulong local_250;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> local_248;
  undefined1 local_230 [16];
  char local_220 [232];
  ios_base local_138 [264];
  
  local_2c4 = (undefined4)CONCAT71(in_register_00000011,showAllErrors);
  kwssys::Directory::Directory(&local_2b0);
  std::__cxx11::string::string((string *)local_230,dir,(allocator *)&local_280);
  SVar6 = kwssys::Directory::Load(&local_2b0,(string *)local_230,(string *)0x0);
  if ((char *)local_230._0_8_ != local_220) {
    operator_delete((void *)local_230._0_8_);
  }
  if (SVar6.Kind_ != Success) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Creating HTML directory: ",0x19);
    if (dir == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
    }
    else {
      sVar7 = strlen(dir);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    SVar6 = kwssys::SystemTools::MakeDirectory(dir,(mode_t *)0x0);
    if (SVar6.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot create HTML directory: ",0x1e);
      if (dir == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar7 = strlen(dir);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,dir,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
  }
  std::__cxx11::string::string((string *)&local_280,dir,(allocator *)local_230);
  std::__cxx11::string::append((char *)&local_280);
  if (((this->m_KWStyleLogo)._M_string_length != 0 || (this->m_ProjectLogo)._M_string_length != 0)
     && (SVar6 = kwssys::SystemTools::MakeDirectory(local_280,(mode_t *)0x0), SVar6.Kind_ != Success
        )) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot create images directory: ",0x20);
    pcVar15 = local_280;
    if (local_280 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
    }
    else {
      sVar7 = strlen(local_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  if ((this->m_ProjectLogo)._M_string_length != 0) {
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char*>((string *)local_230,local_280,local_280 + local_278);
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::string
              ((string *)&local_348,(this->m_ProjectLogo)._M_dataplus._M_p,(allocator *)&local_328);
    kwssys::SystemTools::GetFilenameName(&local_308,&local_348);
    std::__cxx11::string::_M_append(local_230,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_308,(this->m_ProjectLogo)._M_dataplus._M_p,(allocator *)&local_328);
    std::__cxx11::string::string
              ((string *)&local_348,(char *)local_230._0_8_,(allocator *)&local_2e8);
    CVar22 = kwssys::SystemTools::CopyFileIfDifferent(&local_308,&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (CVar22.super_Status.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot copy the project logo file: ",0x23);
      pcVar15 = (this->m_ProjectLogo)._M_dataplus._M_p;
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar7 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," into ",6);
      uVar4 = local_230._0_8_;
      if ((char *)local_230._0_8_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar7 = strlen((char *)local_230._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)uVar4,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    if ((char *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  if ((this->m_KWStyleLogo)._M_string_length != 0) {
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char*>((string *)local_230,local_280,local_280 + local_278);
    std::__cxx11::string::append(local_230);
    std::__cxx11::string::string
              ((string *)&local_348,(this->m_KWStyleLogo)._M_dataplus._M_p,(allocator *)&local_328);
    kwssys::SystemTools::GetFilenameName(&local_308,&local_348);
    std::__cxx11::string::_M_append(local_230,(ulong)local_308._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_308,(this->m_KWStyleLogo)._M_dataplus._M_p,(allocator *)&local_328);
    std::__cxx11::string::string
              ((string *)&local_348,(char *)local_230._0_8_,(allocator *)&local_2e8);
    CVar22 = kwssys::SystemTools::CopyFileIfDifferent(&local_308,&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (CVar22.super_Status.Kind_ != Success) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot copy the KWStyle logo file: ",0x23);
      pcVar15 = (this->m_KWStyleLogo)._M_dataplus._M_p;
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar7 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," into ",6);
      uVar4 = local_230._0_8_;
      if ((char *)local_230._0_8_ == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
      }
      else {
        sVar7 = strlen((char *)local_230._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)uVar4,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    if ((char *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_);
    }
  }
  GenerateMatrix(this,dir,(bool)(char)local_2c4);
  GenerateDescription(this,dir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating HTML...",0x12);
  local_358 = (this->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_260 = dir;
  if (local_358 !=
      (this->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_2b8 = _VTT;
    local_2c0 = _getpwnam;
    local_288 = this;
    do {
      if (((char)local_2c4 == '\0') &&
         ((local_358->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (local_358->m_ErrorList).
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        pPVar19 = local_358 + 1;
      }
      else {
        std::ofstream::ofstream(local_230);
        pcVar1 = (local_358->m_Filename)._M_dataplus._M_p;
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,pcVar1,pcVar1 + (local_358->m_Filename)._M_string_length);
        sVar2 = local_308._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if (sVar2 == 0) {
          pPVar19 = local_358 + 1;
          local_230._0_8_ = local_2b8;
          *(undefined8 *)(local_230 + *(long *)(local_2b8 + -0x18)) = local_2c0;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
        }
        else {
          std::__cxx11::string::string((string *)&local_308,local_260,(allocator *)&local_348);
          std::__cxx11::string::append((char *)&local_308);
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          pcVar1 = (local_358->m_Filename)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,pcVar1,pcVar1 + (local_358->m_Filename)._M_string_length);
          lVar8 = std::__cxx11::string::find((char *)&local_348,0x1776f2,0);
          if (lVar8 != -1) {
            std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_348);
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_328);
            if ((pointer *)local_328.first !=
                &local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_328.first);
            }
          }
          lVar8 = std::__cxx11::string::find((char *)&local_348,0x175454,0);
          if (lVar8 != -1) {
            std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_348);
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_328);
            if ((pointer *)local_328.first !=
                &local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_328.first);
            }
          }
          uVar9 = std::__cxx11::string::find_last_of((char *)&local_348,0x169531,0xffffffffffffffff)
          ;
          if ((uVar9 != 0xffffffffffffffff) && (this->m_MaxDirectoryDepth != 0)) {
            uVar5 = 1;
            do {
              std::__cxx11::string::replace((ulong)&local_348,uVar9,(char *)0x1,0x176e58);
              uVar9 = std::__cxx11::string::find_last_of
                                ((char *)&local_348,0x169531,0xffffffffffffffff);
              if (uVar9 == 0xffffffffffffffff) break;
              bVar21 = uVar5 < this->m_MaxDirectoryDepth;
              uVar5 = uVar5 + 1;
            } while (bVar21);
          }
          lVar8 = std::__cxx11::string::find_last_of((char *)&local_348,0x169531,0xffffffffffffffff)
          ;
          if (lVar8 != -1) {
            std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_348);
            std::__cxx11::string::operator=((string *)&local_348,(string *)&local_328);
            if ((pointer *)local_328.first !=
                &local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete((void *)local_328.first);
            }
          }
          std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_348._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_308);
          std::ofstream::open(local_230,(_Ios_Openmode)local_308._M_dataplus._M_p);
          local_359 = std::__basic_file<char>::is_open();
          if (local_359 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Cannot open file for writing: ",0x1e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
          }
          else {
            CreateHeader(this,(ostream *)local_230,local_308._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_230,"<table width=\"100%\" border=\"0\" height=\"1\">",0x2a)
            ;
            std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
            std::ostream::put((char)local_230);
            std::ostream::flush();
            local_2a8.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.
            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::vector
                      (&local_248,&local_358->m_ErrorList);
            pEVar10 = local_248.
                      super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (pEVar18 = local_248.
                           super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                           _M_impl.super__Vector_impl_data._M_start; pEVar18 != pEVar10;
                pEVar18 = pEVar18 + 1) {
              pplVar20 = (pointer *)pEVar18->line;
              if (pplVar20 <= (undefined1 *)pEVar18->line2) {
                do {
                  local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_328.first = (long)pplVar20;
                  if (local_2a8.
                      super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_2a8.
                      super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    ppVar17 = local_2a8.
                              super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      if (ppVar17->first == (long)(int)pplVar20) {
                        local_2e8._M_dataplus._M_p = (pointer)pEVar18->number;
                        __position._M_current =
                             (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        if (__position._M_current ==
                            (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                                    (&ppVar17->second,__position,(long *)&local_2e8);
                        }
                        else {
                          *__position._M_current = (long)local_2e8._M_dataplus._M_p;
                          (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish = __position._M_current + 1;
                        }
                        goto LAB_00144607;
                      }
                      ppVar17 = ppVar17 + 1;
                    } while (ppVar17 !=
                             local_2a8.
                             super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  local_2e8._M_dataplus._M_p = (pointer)pEVar18->number;
                  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                            (&local_328.second,(iterator)0x0,(long *)&local_2e8);
                  std::
                  vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                  ::push_back(&local_2a8,&local_328);
LAB_00144607:
                  if (local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_328.second.super__Vector_base<long,_std::allocator<long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  pplVar20 = (pointer *)((long)pplVar20 + 1);
                  pEVar10 = local_248.
                            super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                } while (pplVar20 <= (undefined1 *)pEVar18->line2);
              }
            }
            uVar11 = Parser::GetNumberOfLines(local_358);
            if (uVar11 != 0) {
              local_34c = 0;
              uVar9 = 0;
              local_258 = uVar11;
              do {
                local_328.first =
                     (long)&local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl
                            .super__Vector_impl_data._M_finish;
                local_250 = uVar9;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"");
                lVar8 = 4;
                if (local_2a8.
                    super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_2a8.
                    super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  ppVar17 = local_2a8.
                            super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    if (ppVar17->first == (long)((int)uVar9 + 1)) {
                      puVar14 = (unsigned_long *)
                                (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      if (puVar14 ==
                          (unsigned_long *)
                          (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
                        pcVar15 = "<tr>";
                        this = local_288;
                      }
                      else {
                        do {
                          uVar11 = *puVar14;
                          if (local_328.second.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                            Parser::GetErrorTag_abi_cxx11_(&local_2e8,local_358,uVar11);
                            std::__cxx11::string::_M_append
                                      ((char *)&local_328,(ulong)local_2e8._M_dataplus._M_p);
                          }
                          else {
                            std::__cxx11::string::append((char *)&local_328);
                            Parser::GetErrorTag_abi_cxx11_(&local_2e8,local_358,uVar11);
                            std::__cxx11::string::_M_append
                                      ((char *)&local_328,(ulong)local_2e8._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                            operator_delete(local_2e8._M_dataplus._M_p);
                          }
                          this = local_288;
                          puVar14 = puVar14 + 1;
                        } while (puVar14 !=
                                 (unsigned_long *)
                                 (ppVar17->second).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
                        pcVar15 = "<tr>";
                        if (-1 < (long)uVar11) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_230,"<tr bgcolor=\"",0xd);
                          sVar7 = strlen(ErrorColor + uVar11 * 8);
                          lVar8 = 2;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_230,ErrorColor + uVar11 * 8,sVar7);
                          pcVar15 = "\">";
                        }
                      }
                      goto LAB_0014475b;
                    }
                    ppVar17 = ppVar17 + 1;
                  } while (ppVar17 !=
                           local_2a8.
                           super__Vector_base<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                }
                pcVar15 = "<tr>";
LAB_0014475b:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,pcVar15,lVar8);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
                std::ostream::put((char)local_230);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"<td height=\"1\">",0xf);
                uVar9 = (ulong)((int)uVar9 + 1);
                poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"</td>",5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"<td height=\"1\">",0xf);
                lVar8 = local_328.first;
                if ((pointer *)local_328.first == (pointer *)0x0) {
                  std::ios::clear((int)auStack_368 + (int)*(undefined8 *)(local_230._0_8_ + -0x18) +
                                  0x138);
                }
                else {
                  sVar7 = strlen((char *)local_328.first);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,(char *)lVar8,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</td>",5);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
                std::ostream::put((char)local_230);
                std::ostream::flush();
                Parser::GetLine_abi_cxx11_(&local_2e8,local_358,local_250);
                lVar8 = std::__cxx11::string::find((char *)&local_328,0x17562c,0);
                if (lVar8 != -1) {
                  uVar5 = 0;
                  do {
                    if (local_2e8._M_dataplus._M_p[uVar5] != '\n') {
                      if (local_2e8._M_dataplus._M_p[uVar5] != ' ') break;
                      local_2e8._M_dataplus._M_p[uVar5] = '*';
                    }
                    uVar5 = uVar5 + 1;
                  } while( true );
                }
                lVar8 = std::__cxx11::string::find((char *)&local_328,0x175630,0);
                if ((lVar8 != -1) && (1 < (int)(uint)local_2e8._M_string_length)) {
                  uVar13 = (ulong)((uint)local_2e8._M_string_length & 0x7fffffff) + 1;
                  do {
                    if (local_2e8._M_dataplus._M_p[uVar13 - 2] != ' ') break;
                    local_2e8._M_dataplus._M_p[uVar13 - 2] = '*';
                    uVar13 = uVar13 - 1;
                  } while (2 < uVar13);
                }
                cVar16 = (char)&local_2e8;
                uVar13 = std::__cxx11::string::find(cVar16,10);
                if (uVar13 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x1,0x169503);
                }
                while (uVar13 = std::__cxx11::string::find((char *)&local_2e8,0x176488,0),
                      uVar13 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x1,0x175634);
                }
                while (uVar13 = std::__cxx11::string::find((char *)&local_2e8,0x1759b2,0),
                      uVar13 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x1,0x175639);
                }
                uVar13 = std::__cxx11::string::find(cVar16,0x20);
                while (uVar13 != 0xffffffffffffffff) {
                  std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x1,0x17563e);
                  uVar13 = std::__cxx11::string::find(cVar16,0x20);
                }
                if ((local_34c & 1) != 0) {
                  std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0x175645);
                }
                uVar13 = std::__cxx11::string::find((char *)&local_2e8,0x16952a,0);
                if (uVar13 == 0xffffffffffffffff) {
                  uVar13 = std::__cxx11::string::find((char *)&local_2e8,0x16952d,0);
                  if (uVar13 == 0xffffffffffffffff) {
                    if ((local_34c & 1) != 0) goto LAB_00144c4a;
                  }
                  else {
                    do {
                      std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x0,0x175645);
                      uVar13 = std::__cxx11::string::find((char *)&local_2e8,0x16952d,uVar13 + 0x17)
                      ;
                    } while (uVar13 != 0xffffffffffffffff);
                    local_34c = 0xffffff01;
LAB_00144c4a:
                    std::__cxx11::string::replace
                              ((ulong)&local_2e8,local_2e8._M_string_length,(char *)0x0,0x175663);
                  }
                  lVar8 = std::__cxx11::string::find((char *)&local_2e8,0x169530,0);
                  if (lVar8 != -1) {
                    do {
                      std::__cxx11::string::replace
                                ((ulong)&local_2e8,lVar8 + 2,(char *)0x0,0x175663);
                      lVar8 = std::__cxx11::string::find((char *)&local_2e8,0x169530,lVar8 + 8);
                    } while (lVar8 != -1);
                    local_34c = 0;
                  }
                }
                else {
                  std::__cxx11::string::replace((ulong)&local_2e8,uVar13,(char *)0x0,0x175645);
                  std::__cxx11::string::append((char *)&local_2e8);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,
                           "<td height=\"1\"><font face=\"Courier New, Courier, mono\" size=\"2\">",
                           0x40);
                _Var3._M_p = local_2e8._M_dataplus._M_p;
                if (local_2e8._M_dataplus._M_p == (char *)0x0) {
                  std::ios::clear((int)auStack_368 + (int)*(undefined8 *)(local_230._0_8_ + -0x18) +
                                  0x138);
                }
                else {
                  sVar7 = strlen(local_2e8._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_230,_Var3._M_p,sVar7);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_230,"</font></td>",0xc);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
                std::ostream::put((char)local_230);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</tr>",5);
                std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
                std::ostream::put((char)local_230);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                  operator_delete(local_2e8._M_dataplus._M_p);
                }
                if ((pointer *)local_328.first !=
                    &local_328.second.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
                  operator_delete((void *)local_328.first);
                }
              } while (uVar9 < local_258);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"</table>",8);
            std::ios::widen((char)*(undefined8 *)(local_230._0_8_ + -0x18) + (char)local_230);
            std::ostream::put((char)local_230);
            std::ostream::flush();
            CreateFooter(this,(ostream *)local_230);
            std::ofstream::close();
            local_358 = local_358 + 1;
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&local_248);
            std::
            vector<std::pair<long,_std::vector<long,_std::allocator<long>_>_>,_std::allocator<std::pair<long,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::~vector(&local_2a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          local_230._0_8_ = local_2b8;
          *(undefined8 *)(local_230 + *(long *)(local_2b8 + -0x18)) = local_2c0;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          pPVar19 = local_358;
          if (local_359 == '\0') {
            bVar21 = false;
            goto LAB_00144fa6;
          }
        }
      }
      local_358 = pPVar19;
    } while (pPVar19 !=
             (this->m_Parsers->super__Vector_base<kws::Parser,_std::allocator<kws::Parser>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  bVar21 = true;
  std::ostream::flush();
LAB_00144fa6:
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  kwssys::Directory::~Directory(&local_2b0);
  return bVar21;
}

Assistant:

bool Generator::GenerateHTML(const char* dir,bool showAllErrors)
{
  // Check if the directory exists. If not create it
  kwssys::Directory directory;
  if(!directory.Load(dir))
    {
    std::cout << "Creating HTML directory: " << dir << std::endl;
    if(!kwssys::SystemTools::MakeDirectory(dir))
      {
      std::cout << "Cannot create HTML directory: " << dir << std::endl;
      }
    }

  std::string imagedir = dir;
  imagedir += "/images";

  // Copy the m_ProjectLogo and m_KWStyleLogo to the images directory
  if (!m_ProjectLogo.empty() || !m_KWStyleLogo.empty()) {
    if(!kwssys::SystemTools::MakeDirectory(imagedir.c_str()))
      {
      std::cout << "Cannot create images directory: "
                << imagedir.c_str() << std::endl;
      }
  }

  if (!m_ProjectLogo.empty()) {
    std::string imageProjectLogo = imagedir;
    imageProjectLogo += "/";
    imageProjectLogo += kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_ProjectLogo.c_str(),imageProjectLogo.c_str()))
      {
      std::cout << "Cannot copy the project logo file: "
                << m_ProjectLogo.c_str() << " into "
                << imageProjectLogo.c_str() << std::endl;
      }
  }

  if (!m_KWStyleLogo.empty()) {
    std::string imageKWStyleLogo = imagedir;
    imageKWStyleLogo += "/";
    imageKWStyleLogo += kwssys::SystemTools::GetFilenameName(m_KWStyleLogo.c_str());
    if(!kwssys::SystemTools::CopyFileIfDifferent(m_KWStyleLogo.c_str(),imageKWStyleLogo.c_str()))
      {
      std::cout << "Cannot copy the KWStyle logo file: "
                << m_KWStyleLogo.c_str() << " into "
                << imageKWStyleLogo.c_str() << std::endl;
      }
  }

  // Generate the matrix representation
  this->GenerateMatrix(dir,showAllErrors);
  this->GenerateDescription(dir);

  std::cout << "Generating HTML...";

  // For each file we generate an html page
  ParserVectorType::const_iterator it = m_Parsers->begin();
  while(it != m_Parsers->end())
    {
    if (!showAllErrors && (*it).GetErrors().empty()) {
      it++;
      continue;
    }

    std::ofstream file;

    if ((*it).GetFilename().empty()) {
      it++;
      continue;
    }

    // Extract the filename
    // Replace '/' by '_'
    std::string filename = dir;
    filename += "/";
    std::string filename2 = (*it).GetFilename();
    if(long int pos = filename2.find(":/") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }
    if(long int pos = filename2.find(":\\") != std::string::npos)
      {
      filename2 = filename2.substr(pos+2,filename2.size()-pos-2);
      }

      auto slash = static_cast<long int>(filename2.find_last_of("/"));
      unsigned int i = 0;
      while (slash != -1 && i < m_MaxDirectoryDepth) {
        filename2.replace(slash, 1, "_");
        slash = static_cast<long int>(filename2.find_last_of("/"));
        i++;
      }
    slash = static_cast<long int>(filename2.find_last_of("/"));
    if(slash != -1)
      {
      filename2 = filename2.substr(slash+1,filename2.size()-slash-1);
      }
    filename += filename2;

    filename += ".html";

    file.open(filename.c_str(), std::ios::binary | std::ios::out);
    if(!file.is_open())
      {
      std::cout << "Cannot open file for writing: " <<  std::endl;
      return false;
      }

    this->CreateHeader(&file,filename.c_str());

    file << R"(<table width="100%" border="0" height="1">)" << std::endl;

    // To speedup the process we list the lines that have errors
    using ErrorLineType = std::pair<long, std::vector<long>>;
    std::vector<ErrorLineType> errorLines;

    const Parser::ErrorVectorType errors = (*it).GetErrors();
    auto itError = errors.begin();
    while (itError != errors.end()) {
      for (unsigned long index = (*itError).line; index <= (*itError).line2;
           index++) {
        ErrorLineType errLine;
        errLine.first = index;

        // Check if the line already exists
        auto errorLineIt = errorLines.begin();
        while (errorLineIt != errorLines.end()) {
          if ((*errorLineIt).first == static_cast<int>(index)) {
            break;
          }
          errorLineIt++;
        }

        if (errorLineIt != errorLines.end()) {
          (*errorLineIt).second.push_back((*itError).number);
        } else {
          errLine.second.push_back((*itError).number);
          errorLines.push_back(errLine);
        }
      }
      itError++;
     }

    bool comment = false;
    unsigned long nLines = (*it).GetNumberOfLines();
    for(i=0;i<nLines;i++)
      {
      // Look in the errors if there is a match for this line
      long error = -1;
      std::string errorTag = "";

      std::vector<ErrorLineType>::const_iterator errorLineIt = errorLines.begin();
      while(errorLineIt != errorLines.end())
        {
        if((*errorLineIt).first == static_cast<int>(i+1))
          {
          auto err = (*errorLineIt).second.begin();
          while(err != (*errorLineIt).second.end())
            {
            error = *err;
            if (errorTag.empty()) {
              errorTag += (*it).GetErrorTag(error);
            } else {
              errorTag += ",";
              errorTag += (*it).GetErrorTag(error);
            }
             err++;
             }
           break;
           }
         errorLineIt++;
         }

      if(error>=0)
        {
        file << "<tr bgcolor=\"" << ErrorColor[error]  << "\">" << std::endl;
        }
      else
        {
        file << "<tr>" << std::endl;
        }

      // First column is the line number
      file << "<td height=\"1\">" << i+1 << "</td>" << std::endl;

      // Second column is the error tag
      file << "<td height=\"1\">" << errorTag.c_str() << "</td>" << std::endl;

      std::string l = (*it).GetLine(i);

      // If the error is of type INDENT we show the problem as *
      if(errorTag.find("IND") != std::string::npos)
        {
        unsigned int k = 0;
        while((l[k] == ' ') || (l[k] == '\n'))
          {
          if(l[k] == ' ')
            {
            l[k]='*';
            }
          k++;
          }
        }

      // If the error is of type extra spaces we show the problem as *
      if(errorTag.find("ESP") != std::string::npos)
        {
        int k = static_cast<int>(l.size())-1;
        while(k>0 && (l[k] == ' '))
          {
          l[k]='*';
          k--;
          }
        }

      // Remove the first \n
        auto p = static_cast<long int>(l.find('\n'));
        if (p != -1) {
          l.replace(p, 1, "");
        }

      // Replace < and >
        auto inf = static_cast<long int>(l.find("<", 0));
        while (inf != -1) {
          l.replace(inf, 1, "&lt;");
          inf = static_cast<long int>(l.find("<", 0));
        }

        auto sup = static_cast<long int>(l.find(">", 0));
        while (sup != -1) {
          l.replace(sup, 1, "&gt;");
          sup = static_cast<long int>(l.find(">", 0));
        }

      // Replace the space by &nbsp;
        auto space = static_cast<long int>(l.find(' ', 0));
        while (space != -1) {
          l.replace(space, 1, "&nbsp;");
          space = static_cast<long int>(l.find(' ', space + 1));
        }

      // Show the comments in green
      if(comment)
        {
        l.insert(0,"<font color=\"#009933\">");
        }

      // Show the comments in green
      space = static_cast<long int>(l.find("//",0));
      if(space != -1)
        {
        l.insert(space,"<font color=\"#009933\">");
        l += "<font>";
        }
      else
        {
        space = static_cast<long int>(l.find("/*",0));
        while(space != -1)
          {
          comment = true;
          l.insert(space,"<font color=\"#009933\">");
          space = static_cast<long int>(l.find("/*",space+23));
          }

        if(comment)
          {
          l.insert(l.size(),"</font>");
          }

        space = static_cast<long int>(l.find("*/",0));

        while(space != -1)
          {
          comment = false;
          l.insert(space+2,"</font>");
          space = static_cast<long int>(l.find("*/",space+8));
          }
        }
        file
            << R"(<td height="1"><font face="Courier New, Courier, mono" size="2">)"
            << l.c_str() << "</font></td>" << std::endl;
        file << "</tr>" << std::endl;
      }

    file << "</table>" << std::endl;

    this->CreateFooter(&file);

    file.close();
    it++;
    }

  std::cout << "done" << std::endl;
  return true;
}